

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Molecule.cpp
# Opt level: O0

Vector3d * __thiscall OpenMD::Molecule::getCom(Molecule *this,int snapshotNo)

{
  undefined8 in_RSI;
  Vector<double,_3U> *in_RDI;
  RealType mass;
  RealType totalMass;
  iterator i;
  StuntDouble *sd;
  Vector3d *com;
  Vector<double,_3U> *in_stack_ffffffffffffff78;
  Vector<double,_3U> *v1;
  StuntDouble *in_stack_ffffffffffffff98;
  Molecule *in_stack_ffffffffffffffa0;
  __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
  local_28;
  StuntDouble *local_20;
  
  v1 = in_RDI;
  __gnu_cxx::
  __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
  ::__normal_iterator(&local_28);
  Vector3<double>::Vector3((Vector3<double> *)0x23b3e3);
  local_20 = beginIntegrableObject(in_stack_ffffffffffffffa0,(iterator *)in_stack_ffffffffffffff98);
  while (local_20 != (StuntDouble *)0x0) {
    StuntDouble::getMass(local_20);
    StuntDouble::getPos(in_stack_ffffffffffffff98,(int)((ulong)in_RSI >> 0x20));
    OpenMD::operator*(v1,(double)in_RDI);
    Vector<double,_3U>::operator+=(in_RDI,in_stack_ffffffffffffff78);
    local_20 = nextIntegrableObject(in_stack_ffffffffffffffa0,(iterator *)in_stack_ffffffffffffff98)
    ;
  }
  Vector<double,_3U>::operator/=(in_RDI,(double)in_stack_ffffffffffffff78);
  return (Vector3d *)in_RDI;
}

Assistant:

Vector3d Molecule::getCom(int snapshotNo) {
    StuntDouble* sd;
    std::vector<StuntDouble*>::iterator i;
    Vector3d com {};
    RealType totalMass {};
    RealType mass {};

    for (sd = beginIntegrableObject(i); sd != NULL;
         sd = nextIntegrableObject(i)) {
      mass = sd->getMass();
      totalMass += mass;
      com += sd->getPos(snapshotNo) * mass;
    }

    com /= totalMass;

    return com;
  }